

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple-messages.c
# Opt level: O0

int main(void)

{
  int iVar1;
  size_t sVar2;
  char ref3 [21];
  float f;
  int sz;
  char *in_stack_ffffffffffffff28;
  char *pcVar3;
  undefined4 uVar4;
  char *in_stack_ffffffffffffff30;
  int a;
  char *pcVar5;
  undefined4 in_stack_ffffffffffffff38;
  uint in_stack_ffffffffffffff3c;
  undefined4 in_stack_ffffffffffffff40;
  undefined4 in_stack_ffffffffffffff44;
  undefined4 uVar6;
  undefined1 in_stack_ffffffffffffff48 [16];
  undefined1 auVar7 [12];
  undefined1 in_stack_ffffffffffffff58 [16];
  char *in_stack_ffffffffffffff68;
  char *b;
  char *in_stack_ffffffffffffff70;
  char *a_00;
  
  memset(buffer2,0xff,0x100);
  printf("#Suite 1:\n");
  rtosc_message(buffer,0x100,"/page/poge","TIF");
  assert_hex_eq(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff58._8_8_,
                in_stack_ffffffffffffff58._0_8_,in_stack_ffffffffffffff48._8_8_,
                in_stack_ffffffffffffff48._4_4_);
  rtosc_message_length(in_stack_ffffffffffffff48._8_8_,in_stack_ffffffffffffff48._0_8_);
  assert_int_eq((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                in_stack_ffffffffffffff28,0);
  rtosc_narguments(in_stack_ffffffffffffff30);
  assert_int_eq((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                in_stack_ffffffffffffff28,0);
  rtosc_type(in_stack_ffffffffffffff30,(uint)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  assert_char_eq((char)((ulong)in_stack_ffffffffffffff30 >> 0x38),
                 (char)((ulong)in_stack_ffffffffffffff30 >> 0x30),in_stack_ffffffffffffff28,0);
  rtosc_type(in_stack_ffffffffffffff30,(uint)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  assert_char_eq((char)((ulong)in_stack_ffffffffffffff30 >> 0x38),
                 (char)((ulong)in_stack_ffffffffffffff30 >> 0x30),in_stack_ffffffffffffff28,0);
  rtosc_type(in_stack_ffffffffffffff30,(uint)((ulong)in_stack_ffffffffffffff28 >> 0x20));
  assert_char_eq((char)((ulong)in_stack_ffffffffffffff30 >> 0x38),
                 (char)((ulong)in_stack_ffffffffffffff30 >> 0x30),in_stack_ffffffffffffff28,0);
  printf("#Suite 2:\n");
  rtosc_message(buffer,0x100,"/testing","is",0x17,"this string");
  assert_hex_eq(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff58._8_8_,
                in_stack_ffffffffffffff58._0_8_,in_stack_ffffffffffffff48._8_8_,
                in_stack_ffffffffffffff48._4_4_);
  printf("#Suite 3: misc regression tests\n");
  pcVar3 = "/amp-env/av";
  rtosc_message(buffer,0x100,"/register","iis",2,0xd);
  rtosc_argument((char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                 in_stack_ffffffffffffff3c);
  assert_str_eq((char *)CONCAT44(in_stack_ffffffffffffff44,in_stack_ffffffffffffff40),
                (char *)CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),
                in_stack_ffffffffffffff30,(int)((ulong)pcVar3 >> 0x20));
  printf("#checking overflow semantics\n");
  rtosc_message(buffer,0x20,"/testing","is",0x17,"this string");
  assert_int_eq((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                pcVar3,0);
  rtosc_message_length(in_stack_ffffffffffffff48._8_8_,in_stack_ffffffffffffff48._0_8_);
  assert_int_eq((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                pcVar3,0);
  rtosc_message(buffer,0x1f,"/testing","is",0x17,"this string");
  assert_int_eq((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                pcVar3,0);
  assert_int_eq((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                pcVar3,0);
  rtosc_message_length(in_stack_ffffffffffffff48._8_8_,in_stack_ffffffffffffff48._0_8_);
  auVar7 = in_stack_ffffffffffffff48._4_12_;
  assert_int_eq((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),(int)in_stack_ffffffffffffff30,
                pcVar3,0);
  printf("#Check Float Args\n");
  rtosc_message((char *)0x40ca69ab80000000,0x1081e0,(char *)0x20,"oscil/freq","f");
  assert_true((int)((ulong)in_stack_ffffffffffffff30 >> 0x20),pcVar3,0);
  uVar6 = 0x46534d5c;
  rtosc_argument((char *)CONCAT44(0x46534d5c,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c);
  assert_flt_eq((float)((ulong)in_stack_ffffffffffffff30 >> 0x20),SUB84(in_stack_ffffffffffffff30,0)
                ,pcVar3,0);
  uVar4 = (undefined4)((ulong)pcVar3 >> 0x20);
  a = (int)((ulong)in_stack_ffffffffffffff30 >> 0x20);
  printf("#Check simple character retrevial\n");
  pcVar3 = (char *)CONCAT44(uVar4,0xbe);
  iVar1 = 0xef;
  rtosc_message(buffer,0x100,"/test","cccc",0xde,0xad);
  assert_true(a,pcVar3,0);
  rtosc_argument((char *)CONCAT44(uVar6,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c);
  assert_int_eq(a,iVar1,pcVar3,0);
  rtosc_argument((char *)CONCAT44(uVar6,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c);
  assert_int_eq(a,iVar1,pcVar3,0);
  rtosc_message(buffer,0x100,"/b","c",7);
  assert_int_eq(a,iVar1,pcVar3,0);
  rtosc_argument((char *)CONCAT44(uVar6,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c);
  assert_int_eq(a,iVar1,pcVar3,0);
  uVar4 = (undefined4)((ulong)pcVar3 >> 0x20);
  printf("#Check packed blobs\n");
  pcVar3 = (char *)CONCAT44(uVar4,1);
  pcVar5 = buffer2;
  rtosc_message(buffer,0x100,"m","bb",4,buffer2);
  assert_int_eq((int)((ulong)pcVar5 >> 0x20),(int)pcVar5,pcVar3,0);
  rtosc_argument((char *)CONCAT44(uVar6,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c);
  assert_int_eq((int)((ulong)pcVar5 >> 0x20),(int)pcVar5,pcVar3,0);
  rtosc_argument((char *)CONCAT44(uVar6,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c);
  assert_int_eq((int)((ulong)pcVar5 >> 0x20),(int)pcVar5,pcVar3,0);
  printf("#Check \"Ti\"\n");
  b = (char *)0x676e69747365742f;
  a_00 = (char *)0x69542c00000000;
  sVar2 = rtosc_message(buffer,0x100,"/testing","Ti",0x2a);
  if ((int)sVar2 == 0x14) {
    assert_hex_eq(a_00,b,in_stack_ffffffffffffff58._8_8_,in_stack_ffffffffffffff58._0_8_,
                  auVar7._4_8_,auVar7._0_4_);
    rtosc_argument((char *)CONCAT44(uVar6,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c);
    assert_int_eq((int)((ulong)pcVar5 >> 0x20),(int)pcVar5,pcVar3,0);
    rtosc_argument((char *)CONCAT44(uVar6,in_stack_ffffffffffffff40),in_stack_ffffffffffffff3c);
    assert_int_eq((int)((ulong)pcVar5 >> 0x20),(int)pcVar5,pcVar3,0);
  }
  else {
    assert_int_eq((int)((ulong)pcVar5 >> 0x20),(int)pcVar5,pcVar3,0);
  }
  iVar1 = test_summary();
  return iVar1;
}

Assistant:

int main()
{
    memset(buffer2, 0xff, sizeof(buffer2));

    printf("#Suite 1:\n");
    //Check the creation of a simple no arguments message
    int sz = rtosc_message(buffer, 256, "/page/poge", "TIF");
    assert_hex_eq(ref1, buffer, sizeof(ref1), sz,
            "Build A Simple No Allocated Arguments Message", __LINE__);
    assert_int_eq(sizeof(ref1), rtosc_message_length(buffer, 256),
            "Check rtosc_message_length() On Message", __LINE__);

    //Verify that it can be read properly
    assert_int_eq(3, rtosc_narguments(buffer),
            "Check rtosc_narguments() On Message", __LINE__);

    assert_char_eq('T', rtosc_type(buffer, 0), "Check Argument T", __LINE__);
    assert_char_eq('I', rtosc_type(buffer, 1), "Check Argument I", __LINE__);
    assert_char_eq('F', rtosc_type(buffer, 2), "Check Argument F", __LINE__);

    //Check the creation of a more complex message
    printf("#Suite 2:\n");
    sz = rtosc_message(buffer, 256, "/testing", "is", 23, "this string");
    assert_hex_eq(ref2, buffer, sizeof(ref2), sz,
            "Build A Simple With-Allocation Message", __LINE__);

    printf("#Suite 3: misc regression tests\n");
    //Verify that a string argument can be retrieved
    rtosc_message(buffer, 256, "/register", "iis", 2, 13, "/amp-env/av");
    assert_str_eq("/amp-env/av",rtosc_argument(buffer,2).s,
            "Verify Basic String Can Be Read", __LINE__);

    //Verify that buffer overflows will not occur
    printf("#checking overflow semantics\n");
    sz = rtosc_message(buffer, 32, "/testing", "is", 23, "this string");
    assert_int_eq(32, sz, "Build Non-Overflowing Message", __LINE__);
    assert_int_eq(32, rtosc_message_length(buffer,256),
            "Check rtosc_message_length()", __LINE__);

    sz = rtosc_message(buffer, 31, "/testing", "is", 23, "this string");
    assert_int_eq(0, sz, "Build Overflowing Message", __LINE__);
    assert_int_eq(0, *buffer,
            "Verify Buffers Are Cleared When Message Overflows", __LINE__);
    assert_int_eq(0, rtosc_message_length(buffer, 256),
            "Check rtosc_message_length()", __LINE__);

    //check simple float retrevial
    printf("#Check Float Args\n");
    float f = 13523.34;
    sz = rtosc_message(buffer, 32, "oscil/freq", "f", f);
    assert_true(sz != 0, "Build Simple Float Message", __LINE__);
    assert_flt_eq(f, rtosc_argument(buffer,0).f, "Check Float Retrieval", __LINE__);


    //Simple Char Ret
    printf("#Check simple character retrevial\n");
    sz = rtosc_message(buffer, 256, "/test", "cccc", 0xde,0xad,0xbe,0xef);
    assert_true(sz != 0, "Verify Message Can Be Built", __LINE__);

    assert_int_eq(0xde, rtosc_argument(buffer, 0).i,
            "Check First Char Argument", __LINE__);
    assert_int_eq(0xef, rtosc_argument(buffer, 3).i,
            "Check Last Char Argument", __LINE__);

    //Verify argument retrieval for short messages
    sz = rtosc_message(buffer, 256, "/b", "c", 7);
    assert_int_eq(12, sz, "Build Min-Length Allocated Arg Message", __LINE__);
    assert_int_eq(7, rtosc_argument(buffer+1, 0).i,
            "Verify Arg Retrieval", __LINE__);

    //Work on a recently found bug
    printf("#Check packed blobs\n");
    sz = rtosc_message(buffer, 256, "m", "bb", 4, buffer2, 1, buffer2);
    assert_int_eq(24, sz, "Build Packed Blob Message", __LINE__);
    assert_int_eq(4,rtosc_argument(buffer, 0).b.len,
            "Check First Blob Length", __LINE__);
    assert_int_eq(1,rtosc_argument(buffer, 1).b.len,
            "Check Second Blob Length", __LINE__);

    //Check that an integer after a boolean is still appended
    printf("#Check \"Ti\"\n");
    char ref3[] = "/tes""ting""\0\0\0\0"",Ti\0""\0\0\0\x2a";
    sz = rtosc_message(buffer, sizeof(buffer), "/testing", "Ti", 42);
    if(sizeof(ref3)-1 == sz)
    {
        assert_hex_eq(ref3, buffer, sizeof(ref3)-1, sz,
                "'i' after 'T' is still being appended", __LINE__);
        assert_int_eq(rtosc_argument(buffer, 0).T, 1, "1st arg is boolean true", __LINE__);
        assert_int_eq(rtosc_argument(buffer, 1).i, 42, "2nd arg is integer 42", __LINE__);
    }
    else {
        assert_int_eq(sizeof(ref3), sz, "correct buffer size", __LINE__);
    }

    return test_summary();
}